

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_assign_fwd.h
# Opt level: O3

void dlib::
     matrix_assign_big<dlib::matrix<float,0l,0l,dlib::memory_manager_stateless_kernel_1<char>,dlib::column_major_layout>,dlib::matrix_op<dlib::op_pointer_to_mat<float>>>
               (matrix<float,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::column_major_layout>
                *dest,matrix_exp<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_> *src)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  float *pfVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  float *pfVar9;
  
  lVar1 = *(long *)(src + 0x10);
  if (0 < lVar1) {
    lVar2 = *(long *)(src + 8);
    pfVar5 = (dest->data).data;
    lVar3 = (dest->data).nr_;
    lVar7 = 0;
    lVar8 = 0;
    do {
      if (0 < lVar2) {
        lVar4 = *(long *)(src + 0x18);
        pfVar9 = (float *)(*(long *)src + lVar7);
        lVar6 = 0;
        do {
          pfVar5[lVar6] = *pfVar9;
          lVar6 = lVar6 + 1;
          pfVar9 = pfVar9 + lVar4;
        } while (lVar2 != lVar6);
      }
      lVar8 = lVar8 + 1;
      pfVar5 = pfVar5 + lVar3;
      lVar7 = lVar7 + 4;
    } while (lVar8 != lVar1);
  }
  return;
}

Assistant:

void matrix_assign_big (
        matrix_dest_type& dest,
        const matrix_exp<src_exp>& src
    )
    {
        matrix_assign_default(dest,src);
    }